

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O3

void std::__unguarded_linear_insert<embree::PrimRefMB*,__gnu_cxx::__ops::_Val_less_iter>
               (undefined8 *__last)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  
  uVar4 = *__last;
  uVar5 = __last[1];
  uVar6 = __last[2];
  uVar7 = __last[3];
  uVar8 = __last[4];
  uVar9 = __last[5];
  uVar10 = __last[6];
  uVar11 = __last[7];
  uVar1 = __last[8];
  uVar2 = *(undefined4 *)((long)__last + 0x1c);
  uVar3 = *(undefined4 *)((long)__last + 0xc);
  uVar12 = CONCAT44(*(undefined4 *)((long)__last + -0x34),*(undefined4 *)((long)__last + -0x44));
  while (CONCAT44(uVar2,uVar3) < uVar12) {
    *__last = __last[-10];
    __last[1] = __last[-9];
    __last[2] = __last[-8];
    __last[3] = __last[-7];
    __last[4] = __last[-6];
    __last[5] = __last[-5];
    __last[6] = __last[-4];
    __last[7] = __last[-3];
    __last[8] = __last[-2];
    uVar12 = CONCAT44(*(undefined4 *)((long)__last + -0x84),*(undefined4 *)((long)__last + -0x94));
    __last = __last + -10;
  }
  *__last = uVar4;
  __last[1] = uVar5;
  __last[2] = uVar6;
  __last[3] = uVar7;
  __last[4] = uVar8;
  __last[5] = uVar9;
  __last[6] = uVar10;
  __last[7] = uVar11;
  __last[8] = uVar1;
  return;
}

Assistant:

__forceinline Vec3fx& operator =( const Vec3fx& other ) { m128 = other.m128; return *this; }